

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void TestSuite::clearTestFile(string *prefix,TestPosition test_pos)

{
  char *__command;
  int in_ESI;
  string *in_RDI;
  string command;
  int r;
  TestSuite **cur_test;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  TestSuite **local_18;
  int local_c;
  string *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  local_18 = getCurTest();
  if ((local_c != 2) ||
     ((((*local_18)->preserveTestFiles & 1U) == 0 &&
      ((((*local_18)->options).preserveTestFiles & 1U) == 0)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"rm -rf ",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    std::__cxx11::string::operator+=(local_40,local_8);
    std::__cxx11::string::operator+=(local_40,"*");
    __command = (char *)std::__cxx11::string::c_str();
    local_1c = system(__command);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

static void clearTestFile( const std::string& prefix,
                               TestPosition test_pos = MIDDLE_OF_TEST ) {
        TestSuite*& cur_test = TestSuite::getCurTest();
        if ( test_pos == END_OF_TEST &&
             ( cur_test->preserveTestFiles ||
               cur_test->options.preserveTestFiles ) ) return;

        int r;
#if defined(__linux__) || defined(__APPLE__)
        std::string command = "rm -rf ";
        command += prefix;
        command += "*";
        r = system(command.c_str());
        (void)r;

#elif defined(WIN32) || defined(_WIN32)
        std::string command = "del /s /f /q ";
        command += prefix;
        command += "* > NUL";
        r = system(command.c_str());
        (void)r;

        // Windows `del` operation cannot delete folders.
        // Just in case if there are any folders.
        WIN32_FIND_DATA filedata;
        HANDLE hfind;
        std::string query_str = prefix + "*";
        hfind = FindFirstFile(query_str.c_str(), &filedata);
        while (hfind != INVALID_HANDLE_VALUE) {
            std::string f_name(filedata.cFileName);
            size_t f_name_pos = f_name.find(prefix);
            if (f_name_pos != std::string::npos) {
                command = "rmdir /s /q " + f_name + " > NUL";
                r = system(command.c_str());
                (void)r;
            }

            if (!FindNextFile(hfind, &filedata)) {
                FindClose(hfind);
                hfind = INVALID_HANDLE_VALUE;
            }
        }
#endif
    }